

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O3

void __thiscall front::symbol::FunctionSymbol::~FunctionSymbol(FunctionSymbol *this)

{
  ~FunctionSymbol(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~FunctionSymbol() {}